

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void OPNSetPres(FM_OPN *OPN,int pres,int timer_prescaler,int SSGpres)

{
  DEVCB_SRATE_CHG p_Var1;
  uint uVar2;
  INT32 (*paIVar3) [32];
  UINT32 *pUVar4;
  UINT8 *pUVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  
  if ((OPN->smpRateNative != '\0') && (p_Var1 = OPN->smpRateFunc, p_Var1 != (DEVCB_SRATE_CHG)0x0)) {
    uVar2 = (OPN->ST).clock / (uint)pres;
    (OPN->ST).rate = uVar2;
    (*p_Var1)(OPN->smpRateData,uVar2);
  }
  uVar2 = (OPN->ST).rate;
  if (uVar2 == 0) {
    dVar10 = 0.0;
  }
  else {
    dVar10 = ((double)(OPN->ST).clock / (double)uVar2) / (double)pres;
  }
  uVar9 = -(ulong)(ABS(dVar10 + -1.0) < 5e-05);
  dVar10 = (double)(~uVar9 & (ulong)dVar10 | (ulong)((uint)(uVar9 >> 0x20) & 0x3ff00000) << 0x20);
  (OPN->ST).freqbase = dVar10;
  OPN->eg_timer_add = (UINT32)(long)(dVar10 * 65536.0);
  OPN->eg_timer_overflow = 0x30000;
  OPN->lfo_timer_add = (UINT32)(long)(dVar10 * 16777216.0);
  (OPN->ST).timer_prescaler = timer_prescaler;
  if (SSGpres != 0) {
    (*(OPN->ST).SSG_funcs.set_clock)((OPN->ST).SSG_param,((OPN->ST).clock * 2) / (uint)SSGpres);
  }
  dVar10 = (OPN->ST).freqbase;
  paIVar3 = (OPN->ST).dt_tab + 4;
  pUVar5 = "";
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      iVar8 = (int)((double)pUVar5[lVar7] * dVar10 * 64.0);
      paIVar3[-4][lVar7] = iVar8;
      (*paIVar3)[lVar7] = -iVar8;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    lVar6 = lVar6 + 1;
    paIVar3 = paIVar3 + 1;
    pUVar5 = pUVar5 + 0x20;
  } while (lVar6 != 4);
  pUVar4 = OPN->fn_table;
  lVar6 = 0;
  do {
    *pUVar4 = (UINT32)(long)((double)(int)lVar6 * dVar10 * 64.0);
    lVar6 = lVar6 + 0x20;
    pUVar4 = pUVar4 + 1;
  } while (lVar6 != 0x20000);
  OPN->fn_max = (UINT32)(long)(dVar10 * 131072.0 * 64.0);
  return;
}

Assistant:

static void OPNSetPres(FM_OPN *OPN, int pres, int timer_prescaler, int SSGpres)
{
	if (OPN->smpRateNative && OPN->smpRateFunc != NULL)
	{
		OPN->ST.rate = OPN->ST.clock / pres;
		if (OPN->smpRateFunc != NULL)
			OPN->smpRateFunc(OPN->smpRateData, OPN->ST.rate);
	}

	/* frequency base */
	OPN->ST.freqbase = (OPN->ST.rate) ? ((double)OPN->ST.clock / OPN->ST.rate) / pres : 0;
	if (fabs(OPN->ST.freqbase - 1.0) < 0.00005)
		OPN->ST.freqbase = 1.0;

#if 0
	OPN->ST.rate = (double)OPN->ST.clock / pres;
	OPN->ST.freqbase = 1.0;
#endif

	/* EG is updated every 3 samples */
	OPN->eg_timer_add  = (UINT32)((1<<EG_SH) * OPN->ST.freqbase);
	OPN->eg_timer_overflow = ( 3 ) * (1<<EG_SH);

	/* LFO timer increment (every samples) */
	OPN->lfo_timer_add  = (UINT32)((1<<LFO_SH) * OPN->ST.freqbase);

	/* Timer base time */
	OPN->ST.timer_prescaler = timer_prescaler;

	/* SSG part  prescaler set */
	if( SSGpres ) OPN->ST.SSG_funcs.set_clock( OPN->ST.SSG_param, OPN->ST.clock * 2 / SSGpres );

	/* make time tables */
	init_timetables( OPN );
}